

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactQuantizedBvh.cpp
# Opt level: O3

int __thiscall
cbtQuantizedBvhTree::_sort_and_calc_splitting_index
          (cbtQuantizedBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex
          ,int splitAxis)

{
  float *pfVar1;
  cbtVector3 *pcVar2;
  float *pfVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  GIM_BVH_DATA *pGVar8;
  GIM_BVH_DATA *pGVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  cbtScalar *pcVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar21 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined8 local_68;
  float local_60;
  undefined4 local_5c;
  undefined1 local_58 [16];
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  cbtVector3 center;
  
  iVar12 = endIndex - startIndex;
  lVar17 = (long)startIndex;
  local_5c = 0;
  if (iVar12 == 0 || endIndex < startIndex) {
    fVar20 = 0.0;
    fVar22 = 0.0;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar19 = 0.0;
  }
  else {
    fVar20 = 0.0;
    fVar22 = 0.0;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar19 = 0.0;
    pcVar16 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data[lVar17].m_bound.
              m_max.m_floats + 2;
    lVar18 = endIndex - lVar17;
    do {
      fVar25 = *pcVar16;
      pfVar1 = pcVar16 + -6;
      pcVar2 = (cbtVector3 *)(pcVar16 + -2);
      pfVar3 = pcVar16 + -4;
      pcVar16 = pcVar16 + 9;
      lVar18 = lVar18 + -1;
      fVar20 = ((float)*(undefined8 *)pcVar2->m_floats + (float)*(undefined8 *)pfVar1) * 0.5 +
               fVar20;
      fVar22 = ((float)((ulong)*(undefined8 *)pcVar2->m_floats >> 0x20) +
               (float)((ulong)*(undefined8 *)pfVar1 >> 0x20)) * 0.5 + fVar22;
      fVar23 = fVar23 + 0.0;
      fVar24 = fVar24 + 0.0;
      fVar19 = (fVar25 + *pfVar3) * 0.5 + fVar19;
    } while (lVar18 != 0);
  }
  fVar25 = 1.0 / (float)iVar12;
  auVar21._0_4_ = fVar25 * fVar20;
  auVar21._4_4_ = fVar25 * fVar22;
  auVar21._8_4_ = fVar25 * fVar23;
  auVar21._12_4_ = fVar25 * fVar24;
  local_68 = vmovlps_avx(auVar21);
  local_60 = fVar25 * fVar19;
  iVar15 = startIndex;
  if (startIndex < endIndex) {
    lVar18 = endIndex - lVar17;
    fVar19 = *(float *)((long)&local_68 + (long)splitAxis * 4);
    lVar17 = lVar17 * 0x24;
    iVar14 = startIndex;
    do {
      pGVar8 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data;
      uVar6 = *(undefined8 *)((long)(pGVar8->m_bound).m_min.m_floats + lVar17);
      uVar7 = *(undefined8 *)((long)(pGVar8->m_bound).m_max.m_floats + lVar17);
      auVar26._0_4_ = ((float)uVar7 + (float)uVar6) * 0.5;
      auVar26._4_4_ = ((float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar6 >> 0x20)) * 0.5;
      auVar26._8_8_ = 0;
      local_58 = vinsertps_avx(auVar26,ZEXT416((uint)((*(float *)((long)(pGVar8->m_bound).m_max.
                                                                        m_floats + lVar17 + 8) +
                                                      *(float *)((long)(pGVar8->m_bound).m_min.
                                                                       m_floats + lVar17 + 8)) * 0.5
                                                     )),0x28);
      iVar15 = iVar14;
      if (fVar19 < *(float *)(local_58 + (long)splitAxis * 4)) {
        puVar4 = (undefined8 *)((long)(pGVar8->m_bound).m_min.m_floats + lVar17);
        puVar5 = (undefined8 *)((long)(pGVar8->m_bound).m_max.m_floats + lVar17);
        uStack_48 = *puVar4;
        uStack_40 = puVar4[1];
        iVar15 = iVar14 + 1;
        uStack_38 = *puVar5;
        uVar6 = puVar5[1];
        center.m_floats[0] = (cbtScalar)uVar6;
        center.m_floats[1] = SUB84(uVar6,4);
        iVar13 = *(int *)(puVar5 + 2);
        pGVar9 = pGVar8 + iVar14;
        uVar7 = *(undefined8 *)((pGVar9->m_bound).m_min.m_floats + 2);
        uVar10 = *(undefined8 *)(pGVar9->m_bound).m_max.m_floats;
        uVar11 = *(undefined8 *)((pGVar9->m_bound).m_max.m_floats + 2);
        *puVar4 = *(undefined8 *)(pGVar9->m_bound).m_min.m_floats;
        puVar4[1] = uVar7;
        puVar4[2] = uVar10;
        puVar4[3] = uVar11;
        *(int *)(puVar4 + 4) = pGVar8[iVar14].m_data;
        pGVar9 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data;
        pGVar8 = pGVar9 + iVar14;
        *(undefined8 *)(pGVar8->m_bound).m_min.m_floats = uStack_48;
        *(undefined8 *)((pGVar8->m_bound).m_min.m_floats + 2) = uStack_40;
        *(undefined8 *)(pGVar8->m_bound).m_max.m_floats = uStack_38;
        *(undefined8 *)((pGVar8->m_bound).m_max.m_floats + 2) = uVar6;
        pGVar9[iVar14].m_data = iVar13;
      }
      lVar17 = lVar17 + 0x24;
      lVar18 = lVar18 + -1;
      iVar14 = iVar15;
    } while (lVar18 != 0);
  }
  iVar13 = (iVar12 >> 1) + startIndex;
  iVar14 = iVar15;
  if (~(iVar12 / 3) + endIndex <= iVar15) {
    iVar14 = iVar13;
  }
  if (iVar15 <= iVar12 / 3 + startIndex) {
    iVar14 = iVar13;
  }
  return iVar14;
}

Assistant:

int cbtQuantizedBvhTree::_sort_and_calc_splitting_index(
	GIM_BVH_DATA_ARRAY& primitive_boxes, int startIndex,
	int endIndex, int splitAxis)
{
	int i;
	int splitIndex = startIndex;
	int numIndices = endIndex - startIndex;

	// average of centers
	cbtScalar splitValue = 0.0f;

	cbtVector3 means(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (primitive_boxes[i].m_bound.m_max +
											primitive_boxes[i].m_bound.m_min);
		means += center;
	}
	means *= (cbtScalar(1.) / (cbtScalar)numIndices);

	splitValue = means[splitAxis];

	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (primitive_boxes[i].m_bound.m_max +
											primitive_boxes[i].m_bound.m_min);
		if (center[splitAxis] > splitValue)
		{
			//swap
			primitive_boxes.swap(i, splitIndex);
			//swapLeafNodes(i,splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)
	//bool unbalanced2 = true;

	//this should be safe too:
	int rangeBalancedIndices = numIndices / 3;
	bool unbalanced = ((splitIndex <= (startIndex + rangeBalancedIndices)) || (splitIndex >= (endIndex - 1 - rangeBalancedIndices)));

	if (unbalanced)
	{
		splitIndex = startIndex + (numIndices >> 1);
	}

	cbtAssert(!((splitIndex == startIndex) || (splitIndex == (endIndex))));

	return splitIndex;
}